

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_object(cJSON *item,int depth,int fmt,printbuffer *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  void *__s;
  void *__s_00;
  char *__s_01;
  size_t sVar5;
  size_t sVar6;
  int local_c4;
  int local_ac;
  int local_9c;
  int local_8c;
  size_t tmplen;
  int fail;
  int numentries;
  cJSON *child;
  int local_60;
  int j;
  int i;
  int len;
  char *str;
  char *ret;
  char *ptr;
  char *out;
  char **names;
  char **entries;
  printbuffer *p_local;
  int fmt_local;
  int depth_local;
  cJSON *item_local;
  
  ptr = (char *)0x0;
  j = 7;
  local_60 = 0;
  _fail = item->child;
  tmplen._4_4_ = 0;
  bVar1 = false;
  for (; _fail != (cJSON *)0x0; _fail = _fail->next) {
    tmplen._4_4_ = tmplen._4_4_ + 1;
  }
  if (tmplen._4_4_ == 0) {
    if (p == (printbuffer *)0x0) {
      if (fmt == 0) {
        local_9c = 3;
      }
      else {
        local_9c = depth + 4;
      }
      ptr = (char *)(*cJSON_malloc)((long)local_9c);
    }
    else {
      if (fmt == 0) {
        local_8c = 3;
      }
      else {
        local_8c = depth + 4;
      }
      ptr = ensure(p,local_8c);
    }
    if (ptr == (char *)0x0) {
      return (char *)0x0;
    }
    ret = ptr + 1;
    *ptr = '{';
    if (fmt != 0) {
      *ret = '\n';
      ret = ptr + 2;
      for (local_60 = 0; local_60 < depth + -1; local_60 = local_60 + 1) {
        *ret = '\t';
        ret = ret + 1;
      }
    }
    *ret = '}';
    ret[1] = '\0';
    return ptr;
  }
  if (p == (printbuffer *)0x0) {
    __s = (*cJSON_malloc)((long)tmplen._4_4_ << 3);
    if (__s == (void *)0x0) {
      return (char *)0x0;
    }
    __s_00 = (*cJSON_malloc)((long)tmplen._4_4_ << 3);
    if (__s_00 == (void *)0x0) {
      (*cJSON_free)(__s);
      return (char *)0x0;
    }
    memset(__s,0,(long)tmplen._4_4_ << 3);
    memset(__s_00,0,(long)tmplen._4_4_ << 3);
    _fail = item->child;
    if (fmt != 0) {
      j = depth + 8;
    }
    for (; _fail != (cJSON *)0x0; _fail = _fail->next) {
      pcVar4 = print_string_ptr(_fail->string,(printbuffer *)0x0);
      *(char **)((long)__s_00 + (long)local_60 * 8) = pcVar4;
      __s_01 = print_value(_fail,depth + 1,fmt,(printbuffer *)0x0);
      *(char **)((long)__s + (long)local_60 * 8) = __s_01;
      if ((pcVar4 == (char *)0x0) || (__s_01 == (char *)0x0)) {
        bVar1 = true;
      }
      else {
        sVar5 = strlen(__s_01);
        sVar6 = strlen(pcVar4);
        if (fmt == 0) {
          local_c4 = 0;
        }
        else {
          local_c4 = depth + 3;
        }
        j = j + (int)sVar5 + (int)sVar6 + 2 + local_c4;
      }
      local_60 = local_60 + 1;
    }
    if (!bVar1) {
      ptr = (char *)(*cJSON_malloc)((long)j);
    }
    if (ptr == (char *)0x0) {
      bVar1 = true;
    }
    if (bVar1) {
      for (local_60 = 0; local_60 < tmplen._4_4_; local_60 = local_60 + 1) {
        if (*(long *)((long)__s_00 + (long)local_60 * 8) != 0) {
          (*cJSON_free)(*(void **)((long)__s_00 + (long)local_60 * 8));
        }
        if (*(long *)((long)__s + (long)local_60 * 8) != 0) {
          (*cJSON_free)(*(void **)((long)__s + (long)local_60 * 8));
        }
      }
      (*cJSON_free)(__s_00);
      (*cJSON_free)(__s);
      return (char *)0x0;
    }
    *ptr = '{';
    ret = ptr + 1;
    if (fmt != 0) {
      ret = ptr + 2;
      ptr[1] = '\n';
    }
    *ret = '\0';
    for (local_60 = 0; local_60 < tmplen._4_4_; local_60 = local_60 + 1) {
      if (fmt != 0) {
        for (child._4_4_ = 0; child._4_4_ < depth + 1; child._4_4_ = child._4_4_ + 1) {
          *ret = '\t';
          ret = ret + 1;
        }
      }
      sVar5 = strlen(*(char **)((long)__s_00 + (long)local_60 * 8));
      memcpy(ret,*(void **)((long)__s_00 + (long)local_60 * 8),sVar5);
      pcVar4 = ret + sVar5;
      *pcVar4 = ':';
      ret = pcVar4 + 1;
      if (fmt != 0) {
        ret = pcVar4 + 2;
        pcVar4[1] = '\t';
      }
      strcpy(ret,*(char **)((long)__s + (long)local_60 * 8));
      sVar5 = strlen(*(char **)((long)__s + (long)local_60 * 8));
      pcVar4 = ret + sVar5;
      ret = pcVar4;
      if (local_60 != tmplen._4_4_ + -1) {
        ret = pcVar4 + 1;
        *pcVar4 = ',';
      }
      if (fmt != 0) {
        *ret = '\n';
        ret = ret + 1;
      }
      *ret = '\0';
      (*cJSON_free)(*(void **)((long)__s_00 + (long)local_60 * 8));
      (*cJSON_free)(*(void **)((long)__s + (long)local_60 * 8));
    }
    (*cJSON_free)(__s_00);
    (*cJSON_free)(__s);
    if (fmt != 0) {
      for (local_60 = 0; local_60 < depth; local_60 = local_60 + 1) {
        *ret = '\t';
        ret = ret + 1;
      }
    }
    *ret = '}';
    ret[1] = '\0';
  }
  else {
    local_60 = p->offset;
    iVar2 = 1;
    if (fmt != 0) {
      iVar2 = 2;
    }
    pcVar4 = ensure(p,iVar2 + 1);
    if (pcVar4 == (char *)0x0) {
      return (char *)0x0;
    }
    *pcVar4 = '{';
    ret = pcVar4 + 1;
    if (fmt != 0) {
      ret = pcVar4 + 2;
      pcVar4[1] = '\n';
    }
    *ret = '\0';
    p->offset = iVar2 + p->offset;
    iVar2 = depth + 1;
    for (_fail = item->child; _fail != (cJSON *)0x0; _fail = _fail->next) {
      if (fmt != 0) {
        ret = ensure(p,iVar2);
        if (ret == (char *)0x0) {
          return (char *)0x0;
        }
        for (child._4_4_ = 0; child._4_4_ < iVar2; child._4_4_ = child._4_4_ + 1) {
          *ret = '\t';
          ret = ret + 1;
        }
        p->offset = iVar2 + p->offset;
      }
      print_string_ptr(_fail->string,p);
      iVar3 = update(p);
      p->offset = iVar3;
      iVar3 = 1;
      if (fmt != 0) {
        iVar3 = 2;
      }
      pcVar4 = ensure(p,iVar3);
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      *pcVar4 = ':';
      if (fmt != 0) {
        pcVar4[1] = '\t';
      }
      p->offset = iVar3 + p->offset;
      print_value(_fail,iVar2,fmt,p);
      iVar3 = update(p);
      p->offset = iVar3;
      iVar3 = (uint)(fmt != 0) + (uint)(_fail->next != (cJSON *)0x0);
      pcVar4 = ensure(p,iVar3 + 1);
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      ret = pcVar4;
      if (_fail->next != (cJSON *)0x0) {
        ret = pcVar4 + 1;
        *pcVar4 = ',';
      }
      if (fmt != 0) {
        *ret = '\n';
        ret = ret + 1;
      }
      *ret = '\0';
      p->offset = iVar3 + p->offset;
    }
    if (fmt == 0) {
      local_ac = 2;
    }
    else {
      local_ac = depth + 2;
    }
    ret = ensure(p,local_ac);
    if (ret == (char *)0x0) {
      return (char *)0x0;
    }
    if (fmt != 0) {
      for (local_60 = 0; local_60 < depth; local_60 = local_60 + 1) {
        *ret = '\t';
        ret = ret + 1;
      }
    }
    *ret = '}';
    ret[1] = '\0';
    ptr = p->buffer + local_60;
  }
  return ptr;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	size_t tmplen=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Explicitly handle empty object case */
	if (!numentries)
	{
		if (p) out=ensure(p,fmt?depth+4:3);
		else	out=(char*)cJSON_malloc(fmt?depth+4:3);
		if (!out)	return 0;
		ptr=out;*ptr++='{';
		if (fmt) {*ptr++='\n';for (i=0;i<depth-1;i++) *ptr++='\t';}
		*ptr++='}';*ptr++=0;
		return out;
	}
	if (p)
	{
		/* Compose the output: */
		i=p->offset;
		len=fmt?2:1;	ptr=ensure(p,len+1);	if (!ptr) return 0;
		*ptr++='{';	if (fmt) *ptr++='\n';	*ptr=0;	p->offset+=len;
		child=item->child;depth++;
		while (child)
		{
			if (fmt)
			{
				ptr=ensure(p,depth);	if (!ptr) return 0;
				for (j=0;j<depth;j++) *ptr++='\t';
				p->offset+=depth;
			}
			print_string_ptr(child->string,p);
			p->offset=update(p);
			
			len=fmt?2:1;
			ptr=ensure(p,len);	if (!ptr) return 0;
			*ptr++=':';if (fmt) *ptr++='\t';
			p->offset+=len;
			
			print_value(child,depth,fmt,p);
			p->offset=update(p);

			len=(fmt?1:0)+(child->next?1:0);
			ptr=ensure(p,len+1); if (!ptr) return 0;
			if (child->next) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			p->offset+=len;
			child=child->next;
		}
		ptr=ensure(p,fmt?(depth+1):2);	 if (!ptr) return 0;
		if (fmt)	for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate space for the names and the objects */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		names=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!names) {cJSON_free(entries);return 0;}
		memset(entries,0,sizeof(char*)*numentries);
		memset(names,0,sizeof(char*)*numentries);

		/* Collect all the results into our arrays: */
		child=item->child;depth++;if (fmt) len+=depth;
		while (child)
		{
			names[i]=str=print_string_ptr(child->string,0);
			entries[i++]=ret=print_value(child,depth,fmt,0);
			if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
			child=child->next;
		}
		
		/* Try to allocate the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		if (!out) fail=1;

		/* Handle failure */
		if (fail)
		{
			for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
			cJSON_free(names);cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output: */
		*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
		for (i=0;i<numentries;i++)
		{
			if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
			tmplen=strlen(names[i]);memcpy(ptr,names[i],tmplen);ptr+=tmplen;
			*ptr++=':';if (fmt) *ptr++='\t';
			strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
			if (i!=numentries-1) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			cJSON_free(names[i]);cJSON_free(entries[i]);
		}
		
		cJSON_free(names);cJSON_free(entries);
		if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr++=0;
	}
	return out;	
}